

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

void __thiscall StringInstance::StringInstance(StringInstance *this,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined8 *puVar3;
  string local_68;
  string local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"String","");
  Instance::Instance(&this->super_Instance,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__StringInstance_0016bec0;
  (this->_value)._M_dataplus._M_p = (pointer)&(this->_value).field_2;
  (this->_value)._M_string_length = 0;
  (this->_value).field_2._M_local_buf[0] = '\0';
  bVar2 = Grammar::is_string_value(value);
  if (bVar2) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)value);
    str_utils::unescape(&local_68,&local_48,'\"');
    std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

StringInstance::StringInstance(const std::string& value) : Instance("String") {
    if (!Grammar::is_string_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = str_utils::unescape(value.substr(1, int(value.size()) - 2), '"');
}